

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Functional::TruncCase::compare(TruncCase *this,void **inputs,void **outputs)

{
  float fVar1;
  float a;
  Precision PVar2;
  pointer pSVar3;
  uint uVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  ostream *poVar7;
  int iVar8;
  char *pcVar9;
  Hex<8UL> hex;
  ulong uVar10;
  ulong uVar11;
  int roundedVal;
  int iVar12;
  int iVar13;
  deUint32 u32;
  float fVar14;
  HexFloat local_34;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar2 = (pSVar3->varType).m_data.basic.precision;
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar2 - PRECISION_MEDIUMP < 2) {
    uVar11 = 0;
    uVar10 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar10 = uVar11;
    }
    for (; uVar10 != uVar11; uVar11 = uVar11 + 1) {
      fVar14 = *(float *)((long)*inputs + uVar11 * 4);
      if ((int)fVar14 < 0) {
        fVar14 = -(float)(int)-fVar14;
      }
      else {
        fVar14 = (float)(int)fVar14;
      }
      dVar5 = getUlpDiffIgnoreZeroSign(*(float *)((long)*outputs + uVar11 * 4),fVar14);
      if (dVar5 != 0) {
        poVar7 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                  super_basic_ostream<char,_std::char_traits<char>_>,"Expected [");
        poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar11);
        poVar7 = std::operator<<(poVar7,"] = ");
        local_34.value = fVar14;
        poVar7 = Functional::operator<<(poVar7,&local_34);
        pcVar9 = ", got ULP diff ";
LAB_01102144:
        poVar7 = std::operator<<(poVar7,pcVar9);
        hex.value._4_4_ = 0;
        hex.value._0_4_ = dVar5;
        tcu::Format::operator<<(poVar7,hex);
        return false;
      }
    }
  }
  else {
    dVar5 = ~(-1 << (0x17U - (char)*(int *)(&DAT_0186b698 + (ulong)PVar2 * 4) & 0x1f));
    fVar14 = getEpsFromBits(1.0,*(int *)(&DAT_0186b698 + (ulong)PVar2 * 4));
    uVar11 = 0;
    uVar10 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar10 = uVar11;
    }
    for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
      fVar1 = *(float *)((long)*inputs + uVar11 * 4);
      iVar12 = (int)(fVar1 - fVar14);
      a = *(float *)((long)*outputs + uVar11 * 4);
      iVar8 = (int)(fVar14 + fVar1);
      iVar13 = iVar12;
      do {
        if (iVar8 < iVar13) {
          poVar7 = std::operator<<(&(this->super_CommonFunctionCase).m_failMsg.
                                    super_basic_ostream<char,_std::char_traits<char>_>,"Expected [")
          ;
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)uVar11);
          poVar7 = std::operator<<(poVar7,"] = [");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar12);
          poVar7 = std::operator<<(poVar7,", ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar8);
          pcVar9 = "] with ULP threshold ";
          goto LAB_01102144;
        }
        dVar6 = getUlpDiffIgnoreZeroSign(a,(float)iVar13);
        iVar13 = iVar13 + 1;
      } while (dVar5 < dVar6);
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const bool		isNeg		= tcu::Float32(in0).sign() < 0;
				const float		ref			= isNeg ? (-float(int(-in0))) : float(int(in0));

				// \note: trunc() function definition is a bit broad on negative zeros. Ignore result sign if zero.
				const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(in0-eps);
				const int		maxRes		= int(in0+eps);
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}